

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool createEmptyEventPipe(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  int df;
  int sf;
  int i;
  int local_8;
  GLFWbool local_4;
  
  iVar1 = pipe(_glfw.x11.emptyEventPipe);
  if (iVar1 == 0) {
    for (local_8 = 0; local_8 < 2; local_8 = local_8 + 1) {
      uVar2 = fcntl(_glfw.x11.emptyEventPipe[local_8],3,0);
      uVar3 = fcntl(_glfw.x11.emptyEventPipe[local_8],1,0);
      if ((((uVar2 == 0xffffffff) || (uVar3 == 0xffffffff)) ||
          (iVar1 = fcntl(_glfw.x11.emptyEventPipe[local_8],4,(ulong)(uVar2 | 0x800)), iVar1 == -1))
         || (iVar1 = fcntl(_glfw.x11.emptyEventPipe[local_8],2,(ulong)(uVar3 | 1)), iVar1 == -1)) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        _glfwInputError(0x10008,"X11: Failed to set flags for empty event pipe: %s",pcVar5);
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _glfwInputError(0x10008,"X11: Failed to create empty event pipe: %s",pcVar5);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static GLFWbool createEmptyEventPipe(void)
{
    if (pipe(_glfw.x11.emptyEventPipe) != 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "X11: Failed to create empty event pipe: %s",
                        strerror(errno));
        return GLFW_FALSE;
    }

    for (int i = 0; i < 2; i++)
    {
        const int sf = fcntl(_glfw.x11.emptyEventPipe[i], F_GETFL, 0);
        const int df = fcntl(_glfw.x11.emptyEventPipe[i], F_GETFD, 0);

        if (sf == -1 || df == -1 ||
            fcntl(_glfw.x11.emptyEventPipe[i], F_SETFL, sf | O_NONBLOCK) == -1 ||
            fcntl(_glfw.x11.emptyEventPipe[i], F_SETFD, df | FD_CLOEXEC) == -1)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "X11: Failed to set flags for empty event pipe: %s",
                            strerror(errno));
            return GLFW_FALSE;
        }
    }

    return GLFW_TRUE;
}